

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O2

wstring * __thiscall
Centaurus::readwcsfromfile_abi_cxx11_
          (wstring *__return_storage_ptr__,Centaurus *this,char *filename)

{
  undefined8 uVar1;
  wifstream ifs;
  undefined8 auStack_130 [36];
  
  std::wifstream::wifstream(&ifs,(char *)this,_S_in);
  uVar1 = *(undefined8 *)((long)auStack_130 + *(long *)(_ifs + -0x18));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::wstring::_M_construct<std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>
            ((wstring *)__return_storage_ptr__,uVar1,0xffffffffffffffff,0,0xffffffff);
  std::wifstream::~wifstream(&ifs);
  return __return_storage_ptr__;
}

Assistant:

std::wstring readwcsfromfile(const char *filename)
{
	std::wifstream ifs(filename);

	return std::wstring(std::istreambuf_iterator<wchar_t>(ifs), {});
}